

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

bool wasm::Match::Internal::
     Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
     ::match(matched_t<wasm::Select_*> candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            *matchers)

{
  matched_t<wasm::Const_*> pCVar1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMVar2;
  matched_t<wasm::Const_*> *ppCVar3;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar4;
  bool bVar5;
  Literal local_40;
  
  pCVar1 = (matched_t<wasm::Const_*>)candidate->ifTrue;
  if ((pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
  {
    return false;
  }
  pMVar2 = matchers->curr;
  ppCVar3 = pMVar2->binder;
  if (ppCVar3 != (matched_t<wasm::Const_*> *)0x0) {
    *ppCVar3 = pCVar1;
  }
  Literal::Literal(&local_40,&pCVar1->value);
  bVar5 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
          ::matches(&(pMVar2->submatchers).curr,&local_40);
  Literal::~Literal(&local_40);
  if (bVar5) {
    pCVar1 = (matched_t<wasm::Const_*>)candidate->ifFalse;
    if ((pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId
       ) {
      return false;
    }
    pMVar2 = (matchers->next).curr;
    ppCVar3 = pMVar2->binder;
    if (ppCVar3 != (matched_t<wasm::Const_*> *)0x0) {
      *ppCVar3 = pCVar1;
    }
    Literal::Literal(&local_40,&pCVar1->value);
    bVar5 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
            ::matches(&(pMVar2->submatchers).curr,&local_40);
    Literal::~Literal(&local_40);
    if (bVar5) {
      ppEVar4 = ((matchers->next).next.curr)->binder;
      if (ppEVar4 == (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        return true;
      }
      *ppEVar4 = candidate->condition;
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }